

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcActor.super_IfcObject.field_0x48;
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0x48 = &PTR__IfcOccupant_008afe90;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject.field_0x30 = &PTR__IfcOccupant_008aff58;
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0xd0 = &PTR__IfcOccupant_008afeb8;
  *(undefined ***)&this[-1].super_IfcActor.super_IfcObject.field_0xe0 = &PTR__IfcOccupant_008afee0;
  *(undefined ***)&this[-1].field_0x118 = &PTR__IfcOccupant_008aff08;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject = &PTR__IfcOccupant_008aff30;
  puVar1 = *(undefined1 **)&(this->super_IfcActor).super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcActor).super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcActor::~IfcActor((IfcActor *)this_00,&PTR_construction_vtable_24__008aff70);
  operator_delete(this_00);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}